

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O3

void http_rd_cb(void *arg)

{
  nni_mtx *mtx;
  nni_aio *pnVar1;
  nng_err result;
  size_t sVar2;
  ulong uVar3;
  ulong n;
  nni_iov *local_40;
  nni_iov *iov;
  uint niov;
  
  mtx = (nni_mtx *)((long)arg + 0x3e0);
  nni_mtx_lock(mtx);
  result = nni_aio_result((nni_aio *)((long)arg + 0x50));
  if (result == NNG_OK) {
    sVar2 = nni_aio_count((nni_aio *)((long)arg + 0x50));
    if (*(char *)((long)arg + 0x8e0) == '\x01') {
      uVar3 = *(long *)((long)arg + 0x878) + sVar2;
      *(ulong *)((long)arg + 0x878) = uVar3;
      if (*(ulong *)((long)arg + 0x868) < uVar3) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_conn.c"
                  ,0x187,"conn->rd_put <= conn->bufsz");
      }
      http_rd_start((nni_http_conn *)arg);
    }
    else {
      if (*(long *)((long)arg + 0x870) != *(long *)((long)arg + 0x878)) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_conn.c"
                  ,399,"conn->rd_get == conn->rd_put");
      }
      pnVar1 = *(nni_aio **)((long)arg + 0x40);
      if (pnVar1 != (nni_aio *)0x0) {
        nni_aio_get_iov(pnVar1,(uint *)((long)&iov + 4),&local_40);
        if (sVar2 != 0 && iov._4_4_ != 0) {
          do {
            uVar3 = local_40->iov_len;
            n = sVar2;
            if (uVar3 < sVar2) {
              n = uVar3;
            }
            local_40->iov_len = uVar3 - n;
            local_40->iov_buf = (void *)((long)local_40->iov_buf + n);
            nni_aio_bump_count(pnVar1,n);
            if (local_40->iov_len == 0) {
              iov._4_4_ = iov._4_4_ - 1;
              local_40 = local_40 + 1;
            }
          } while ((iov._4_4_ != 0) && (sVar2 = sVar2 - n, sVar2 != 0));
        }
        nni_aio_set_iov(pnVar1,iov._4_4_,local_40);
        http_rd_start((nni_http_conn *)arg);
        nni_mtx_unlock(mtx);
        return;
      }
    }
  }
  else {
    pnVar1 = *(nni_aio **)((long)arg + 0x40);
    if (pnVar1 != (nni_aio *)0x0) {
      *(undefined8 *)((long)arg + 0x40) = 0;
      nni_aio_finish_error(pnVar1,result);
    }
    http_close((nni_http_conn *)arg);
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
http_rd_cb(void *arg)
{
	nni_http_conn *conn = arg;
	nni_aio       *aio  = &conn->rd_aio;
	nni_aio       *uaio;
	size_t         cnt;
	nng_err        rv;
	unsigned       niov;
	nni_iov       *iov;

	nni_mtx_lock(&conn->mtx);

	if ((rv = nni_aio_result(aio)) != 0) {
		if ((uaio = conn->rd_uaio) != NULL) {
			conn->rd_uaio = NULL;
			nni_aio_finish_error(uaio, rv);
		}
		http_close(conn);
		nni_mtx_unlock(&conn->mtx);
		return;
	}

	cnt = nni_aio_count(aio);

	// If we were reading into the buffer, then advance location(s).
	if (conn->buffered) {
		conn->rd_put += cnt;
		NNI_ASSERT(conn->rd_put <= conn->bufsz);
		http_rd_start(conn);
		nni_mtx_unlock(&conn->mtx);
		return;
	}

	// Otherwise we are completing a USER request, and there should
	// be no data left in the user buffer.
	NNI_ASSERT(conn->rd_get == conn->rd_put);

	if ((uaio = conn->rd_uaio) == NULL) {
		// This indicates that a read request was canceled.  This
		// can occur only when shutting down, really.
		nni_mtx_unlock(&conn->mtx);
		return;
	}

	nni_aio_get_iov(uaio, &niov, &iov);

	while ((niov != 0) && (cnt != 0)) {
		// Pull up data from the buffer if possible.
		size_t n = iov[0].iov_len;
		if (n > cnt) {
			n = cnt;
		}
		iov[0].iov_len -= n;
		NNI_INCPTR(iov[0].iov_buf, n);
		nni_aio_bump_count(uaio, n);
		cnt -= n;

		if (iov[0].iov_len == 0) {
			niov--;
			iov = &iov[1];
		}
	}
	nni_aio_set_iov(uaio, niov, iov);

	// Resubmit the start.  This will attempt to consume data
	// from the read buffer (there won't be any), and then either
	// complete the I/O (for HTTP_RD_RAW, or if there is nothing left),
	// or submit another physio.
	http_rd_start(conn);
	nni_mtx_unlock(&conn->mtx);
}